

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O1

void write_iteration_info(double mu,double p_rho,double eta,uint global_iteration)

{
  char filename [64];
  char info [131072];
  char acStack_20058 [64];
  char acStack_20018 [131080];
  
  snprintf(acStack_20058,0x40,"results/dat/%u/info",global_iteration);
  snprintf(acStack_20058 + 0x40,0x20000,"mu value: %.le\np_rho value: %.le\neta value: %.le\n     ",
           SUB84(mu,0),p_rho,eta);
  rewrite_file(acStack_20058,acStack_20058 + 0x40);
  return;
}

Assistant:

void write_iteration_info (double mu, double p_rho, double eta, unsigned global_iteration) {
  char filename[MAX_FILENAME_SIZE] = "";
  char info[MAX_BUFFER_SIZE];

  snprintf (filename, MAX_FILENAME_SIZE, "results/dat/%u/info", global_iteration);
  snprintf (info, MAX_BUFFER_SIZE, 
    "mu value: %.le\n\
p_rho value: %.le\n\
eta value: %.le\n\
     ",
     mu,
     p_rho,
     eta);

  rewrite_file (filename, info);
}